

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.hpp
# Opt level: O0

void msgpack::v3::unpack(object_handle *result,char *data,size_t len,size_t *off,bool *referenced,
                        unpack_reference_func f,void *user_data,unpack_limit *limit)

{
  parse_return pVar1;
  bool *in_RDX;
  object *in_RSI;
  zone *in_RDI;
  undefined1 *in_R8;
  unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_> *in_R9;
  size_t *unaff_retaddr;
  unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_> *in_stack_00000008;
  char *in_stack_00000010;
  unpack_reference_func in_stack_00000020;
  void *in_stack_00000028;
  unpack_limit *in_stack_00000030;
  parse_return ret;
  unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_> z;
  object obj;
  pointer in_stack_ffffffffffffff38;
  zone *in_stack_ffffffffffffff40;
  object local_48;
  unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_> *local_30;
  undefined1 *local_28;
  
  local_30 = in_R9;
  local_28 = in_R8;
  v2::object::object((object *)0x1dd4e4);
  v1::zone::operator_new((size_t)in_stack_ffffffffffffff40);
  v1::zone::zone(in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
  std::unique_ptr<msgpack::v1::zone,std::default_delete<msgpack::v1::zone>>::
  unique_ptr<std::default_delete<msgpack::v1::zone>,void>
            ((unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_> *)
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  *local_28 = 0;
  std::unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>::operator*
            ((unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_> *)
             in_stack_ffffffffffffff40);
  pVar1 = v2::detail::unpack_imp
                    (in_stack_00000010,(size_t)in_stack_00000008,unaff_retaddr,in_RDI,in_RSI,in_RDX,
                     in_stack_00000020,in_stack_00000028,in_stack_00000030);
  if (pVar1 == PARSE_EXTRA_BYTES) {
    v1::object_handle::set((object_handle *)in_RDI,&local_48);
    v1::object_handle::zone((object_handle *)in_RDI);
    std::unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>::operator=
              (in_stack_00000008,local_30);
  }
  else if (pVar1 == PARSE_SUCCESS) {
    v1::object_handle::set((object_handle *)in_RDI,&local_48);
    v1::object_handle::zone((object_handle *)in_RDI);
    std::unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>::operator=
              (in_stack_00000008,local_30);
  }
  std::unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>::~unique_ptr
            (in_stack_00000008);
  return;
}

Assistant:

inline void unpack(
    msgpack::object_handle& result,
    const char* data, std::size_t len, std::size_t& off, bool& referenced,
    msgpack::unpack_reference_func f, void* user_data,
    msgpack::unpack_limit const& limit)
{
    msgpack::object obj;
    msgpack::unique_ptr<msgpack::zone> z(new msgpack::zone);
    referenced = false;
    parse_return ret = detail::unpack_imp(
        data, len, off, *z, obj, referenced, f, user_data, limit);

    switch(ret) {
    case PARSE_SUCCESS:
        result.set(obj);
        result.zone() = msgpack::move(z);
        return;
    case PARSE_EXTRA_BYTES:
        result.set(obj);
        result.zone() = msgpack::move(z);
        return;
    default:
        return;
    }
}